

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIdToTrueFalse(Expr *pExpr)

{
  u32 uVar1;
  u32 v;
  Expr *pExpr_local;
  
  if (((pExpr->flags & 0x4000800) == 0) &&
     (uVar1 = sqlite3IsTrueOrFalse((pExpr->u).zToken), uVar1 != 0)) {
    pExpr->op = 0xaa;
    pExpr->flags = uVar1 | pExpr->flags;
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIdToTrueFalse(Expr *pExpr){
  u32 v;
  assert( pExpr->op==TK_ID || pExpr->op==TK_STRING );
  if( !ExprHasProperty(pExpr, EP_Quoted|EP_IntValue)
   && (v = sqlite3IsTrueOrFalse(pExpr->u.zToken))!=0
  ){
    pExpr->op = TK_TRUEFALSE;
    ExprSetProperty(pExpr, v);
    return 1;
  }
  return 0;
}